

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

int exp1(LexState *ls)

{
  undefined1 local_28 [4];
  int reg;
  expdesc e;
  LexState *ls_local;
  
  e._16_8_ = ls;
  expr(ls,(expdesc *)local_28);
  luaK_exp2nextreg(*(FuncState **)(e._16_8_ + 0x30),(expdesc *)local_28);
  return e.k;
}

Assistant:

static int exp1 (LexState *ls) {
  expdesc e;
  int reg;
  expr(ls, &e);
  luaK_exp2nextreg(ls->fs, &e);
  lua_assert(e.k == VNONRELOC);
  reg = e.u.info;
  return reg;
}